

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

void QHttpHeadersPrivate::replaceOrAppend(Self *d,HeaderName *name,QByteArray value)

{
  QHttpHeadersPrivate *pQVar1;
  iterator iVar2;
  iterator iVar3;
  QArrayDataPointer<char> *in_RDX;
  QList<Header> *this;
  long in_FS_OFFSET;
  Header local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(d);
  iVar2 = QList<Header>::begin(&((d->d).ptr)->headers);
  iVar3 = QList<Header>::end(&((d->d).ptr)->headers);
  iVar2 = std::
          __find_if<QList<Header>::iterator,__gnu_cxx::__ops::_Iter_pred<headerNameMatches(HeaderName_const&)::__0>>
                    (iVar2,iVar3,
                     (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_access_qhttpheaders_cpp:785:12)>
                      )name);
  iVar3 = QList<Header>::end(&((d->d).ptr)->headers);
  if (iVar2.i == iVar3.i) {
    pQVar1 = (d->d).ptr;
    std::__detail::__variant::_Copy_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray>::
    _Copy_ctor_base((_Copy_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_60,
                    (_Copy_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)name);
    local_60.value.d.d = in_RDX->d;
    local_60.value.d.ptr = in_RDX->ptr;
    in_RDX->d = (Data *)0x0;
    in_RDX->ptr = (char *)0x0;
    local_60.value.d.size = in_RDX->size;
    in_RDX->size = 0;
    QList<Header>::emplaceBack<Header>(&pQVar1->headers,&local_60);
    Header::~Header(&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    QArrayDataPointer<char>::swap(&((iVar2.i)->value).d,in_RDX);
    this = &((d->d).ptr)->headers;
    iVar3 = QList<Header>::end(this);
    iVar2 = std::remove_if<QList<Header>::iterator,headerNameMatches(HeaderName_const&)::__0>
                      (iVar2.i + 1,iVar3,(anon_class_8_1_898f2789_for__M_pred)name);
    iVar3 = QList<Header>::end(&((d->d).ptr)->headers);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QList<Header>::erase(this,(const_iterator)iVar2.i,(const_iterator)iVar3.i);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeadersPrivate::replaceOrAppend(Self &d, const HeaderName &name, QByteArray value)
{
    d.detach();
    auto it = std::find_if(d->headers.begin(), d->headers.end(), headerNameMatches(name));
    if (it != d->headers.end()) {
        // Found something to replace => replace, and then rearrange any remaining
        // matches to the end and erase them
        it->value = std::move(value);
        d->headers.erase(
                std::remove_if(it + 1, d->headers.end(), headerNameMatches(name)),
                d->headers.end());
    } else {
        // Found nothing to replace => append
        d->headers.append(Header{name, std::move(value)});
    }
}